

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLLibraryArticulatedSystemsLoader.cpp
# Opt level: O2

bool __thiscall
COLLADASaxFWL::LibraryArticulatedSystemsLoader::begin__kinematics
          (LibraryArticulatedSystemsLoader *this)

{
  int iVar1;
  undefined4 extraout_var;
  KinematicsController *this_00;
  URI uri;
  URI UStack_f8;
  
  iVar1 = (*(this->super_FilePartLoader).super_IFilePartLoader.super_ExtraDataLoader.
            _vptr_ExtraDataLoader[0xb])();
  COLLADABU::URI::URI(&UStack_f8,(URI *)CONCAT44(extraout_var,iVar1),false);
  COLLADABU::URI::setFragment(&UStack_f8,&this->mCurrentArticulatedId);
  this_00 = (KinematicsController *)operator_new(0x140);
  KinematicsController::KinematicsController(this_00,&UStack_f8,&this->mCurrentArticulatedName);
  this->mCurrentKinematicsController = this_00;
  COLLADABU::URI::~URI(&UStack_f8);
  return true;
}

Assistant:

bool LibraryArticulatedSystemsLoader::begin__kinematics()
	{
		COLLADABU::URI uri(getFileUri());
		uri.setFragment( mCurrentArticulatedId );
		mCurrentKinematicsController = new KinematicsController( uri, mCurrentArticulatedName );
		return true;
	}